

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
kj::Vector<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>::setCapacity
          (Vector<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry> *this,size_t newSize
          )

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>_conflict *pAVar2;
  size_t __length;
  size_t extraout_RDX;
  size_t size;
  undefined1 local_38 [8];
  ArrayBuilder<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>_conflict newBuilder;
  size_t newSize_local;
  Vector<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)
           ArrayBuilder<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>::size
                     (&this->builder);
  size = __length;
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>::truncate
              (&this->builder,(char *)newBuilder.disposer,__length);
    size = extraout_RDX;
  }
  heapArrayBuilder<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Entry>
            ((ArrayBuilder<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>_conflict *)
             local_38,(kj *)newBuilder.disposer,size);
  pAVar2 = mv<kj::ArrayBuilder<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Entry>>
                     ((ArrayBuilder<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>_conflict
                       *)this);
  ArrayBuilder<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Entry>::
  addAll<kj::ArrayBuilder<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Entry>>
            ((ArrayBuilder<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Entry> *)local_38,
             pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Entry>>
                     ((ArrayBuilder<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>_conflict
                       *)local_38);
  ArrayBuilder<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>::operator=
            (&this->builder,pAVar2);
  ArrayBuilder<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>::~ArrayBuilder
            ((ArrayBuilder<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry> *)local_38)
  ;
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }